

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O0

void __thiscall tokenizer::tokenizer(tokenizer *this,string *input)

{
  string *input_local;
  tokenizer *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->name);
  load_token_name_id(this);
  return;
}

Assistant:

tokenizer(const string &input): text(input) {
        load_token_name_id();
    }